

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileinfo.c
# Opt level: O2

void Curl_fileinfo_dtor(void *user,void *element)

{
  if (element != (void *)0x0) {
    (*Curl_cfree)(*(void **)((long)element + 0x68));
    *(undefined8 *)((long)element + 0x68) = 0;
    (*Curl_cfree)(element);
    return;
  }
  return;
}

Assistant:

void Curl_fileinfo_dtor(void *user, void *element)
{
  struct fileinfo *finfo = element;
  (void) user;
  if(!finfo)
    return;

  Curl_safefree(finfo->info.b_data);

  free(finfo);
}